

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct4x4_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar10;
  undefined1 auVar9 [16];
  int iVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  undefined1 auVar26 [16];
  int iVar31;
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  lVar4 = (long)bit;
  iVar8 = LoadMaskz2[lVar4 * 8 + 6][0];
  iVar6 = -iVar8;
  iVar5 = 1 << ((char)bit - 1U & 0x1f);
  iVar7 = bd + (uint)(do_cols == 0) * 2;
  auVar12 = ZEXT416((uint)bit);
  iVar3 = 0x8000;
  if (0xf < iVar7 + 6) {
    iVar3 = 1 << ((char)iVar7 + 5U & 0x1f);
  }
  iVar7 = -iVar3;
  iVar3 = iVar3 + -1;
  uVar1 = *(undefined4 *)(&DAT_00431cc0 + lVar4 * 0x20);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_00431d00 + lVar4 * 0x100);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar34._4_4_ = iVar8;
  auVar34._0_4_ = iVar8;
  auVar34._8_4_ = iVar8;
  auVar34._12_4_ = iVar8;
  auVar33._4_4_ = iVar6;
  auVar33._0_4_ = iVar6;
  auVar33._8_4_ = iVar6;
  auVar33._12_4_ = iVar6;
  auVar9 = pmulld((undefined1  [16])*in,auVar35);
  auVar35 = pmulld(auVar35,(undefined1  [16])in[2]);
  iVar8 = auVar9._0_4_ + iVar5;
  iVar6 = auVar9._4_4_ + iVar5;
  iVar10 = auVar9._8_4_ + iVar5;
  iVar11 = auVar9._12_4_ + iVar5;
  iVar16 = iVar8 + auVar35._0_4_ >> auVar12;
  iVar18 = iVar6 + auVar35._4_4_ >> auVar12;
  iVar20 = iVar10 + auVar35._8_4_ >> auVar12;
  iVar22 = iVar11 + auVar35._12_4_ >> auVar12;
  iVar8 = iVar8 - auVar35._0_4_ >> auVar12;
  iVar6 = iVar6 - auVar35._4_4_ >> auVar12;
  iVar10 = iVar10 - auVar35._8_4_ >> auVar12;
  iVar11 = iVar11 - auVar35._12_4_ >> auVar12;
  auVar9 = pmulld(auVar34,(undefined1  [16])in[1]);
  auVar35 = pmulld((undefined1  [16])in[1],auVar26);
  auVar34 = pmulld(auVar33,(undefined1  [16])in[3]);
  iVar36 = auVar35._0_4_ + iVar5 + auVar34._0_4_ >> auVar12;
  iVar37 = auVar35._4_4_ + iVar5 + auVar34._4_4_ >> auVar12;
  iVar38 = auVar35._8_4_ + iVar5 + auVar34._8_4_ >> auVar12;
  iVar39 = auVar35._12_4_ + iVar5 + auVar34._12_4_ >> auVar12;
  auVar34 = pmulld((undefined1  [16])in[3],auVar26);
  iVar13 = auVar9._0_4_ + iVar5 + auVar34._0_4_ >> auVar12;
  iVar14 = auVar9._4_4_ + iVar5 + auVar34._4_4_ >> auVar12;
  iVar15 = auVar9._8_4_ + iVar5 + auVar34._8_4_ >> auVar12;
  iVar5 = auVar9._12_4_ + iVar5 + auVar34._12_4_ >> auVar12;
  iVar24 = iVar13 + iVar16;
  iVar27 = iVar14 + iVar18;
  iVar29 = iVar15 + iVar20;
  iVar31 = iVar5 + iVar22;
  iVar16 = iVar16 - iVar13;
  iVar18 = iVar18 - iVar14;
  iVar20 = iVar20 - iVar15;
  iVar22 = iVar22 - iVar5;
  uVar25 = (uint)(iVar24 < iVar7) * iVar7 | (uint)(iVar24 >= iVar7) * iVar24;
  uVar28 = (uint)(iVar27 < iVar7) * iVar7 | (uint)(iVar27 >= iVar7) * iVar27;
  uVar30 = (uint)(iVar29 < iVar7) * iVar7 | (uint)(iVar29 >= iVar7) * iVar29;
  uVar32 = (uint)(iVar31 < iVar7) * iVar7 | (uint)(iVar31 >= iVar7) * iVar31;
  uVar17 = (uint)(iVar16 < iVar7) * iVar7 | (uint)(iVar16 >= iVar7) * iVar16;
  uVar19 = (uint)(iVar18 < iVar7) * iVar7 | (uint)(iVar18 >= iVar7) * iVar18;
  uVar21 = (uint)(iVar20 < iVar7) * iVar7 | (uint)(iVar20 >= iVar7) * iVar20;
  uVar23 = (uint)(iVar22 < iVar7) * iVar7 | (uint)(iVar22 >= iVar7) * iVar22;
  *(uint *)*out = (uint)(iVar3 < (int)uVar25) * iVar3 | (iVar3 >= (int)uVar25) * uVar25;
  *(uint *)((long)*out + 4) = (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
  *(uint *)(*out + 1) = (uint)(iVar3 < (int)uVar30) * iVar3 | (iVar3 >= (int)uVar30) * uVar30;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
  *(uint *)out[3] = (uint)(iVar3 < (int)uVar17) * iVar3 | (iVar3 >= (int)uVar17) * uVar17;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar3 < (int)uVar19) * iVar3 | (iVar3 >= (int)uVar19) * uVar19;
  *(uint *)(out[3] + 1) = (uint)(iVar3 < (int)uVar21) * iVar3 | (iVar3 >= (int)uVar21) * uVar21;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar3 < (int)uVar23) * iVar3 | (iVar3 >= (int)uVar23) * uVar23;
  iVar5 = iVar36 + iVar8;
  iVar13 = iVar37 + iVar6;
  iVar14 = iVar38 + iVar10;
  iVar15 = iVar39 + iVar11;
  iVar8 = iVar8 - iVar36;
  iVar6 = iVar6 - iVar37;
  iVar10 = iVar10 - iVar38;
  iVar11 = iVar11 - iVar39;
  uVar25 = (uint)(iVar5 < iVar7) * iVar7 | (uint)(iVar5 >= iVar7) * iVar5;
  uVar28 = (uint)(iVar13 < iVar7) * iVar7 | (uint)(iVar13 >= iVar7) * iVar13;
  uVar30 = (uint)(iVar14 < iVar7) * iVar7 | (uint)(iVar14 >= iVar7) * iVar14;
  uVar32 = (uint)(iVar15 < iVar7) * iVar7 | (uint)(iVar15 >= iVar7) * iVar15;
  uVar17 = (uint)(iVar8 < iVar7) * iVar7 | (uint)(iVar8 >= iVar7) * iVar8;
  uVar19 = (uint)(iVar6 < iVar7) * iVar7 | (uint)(iVar6 >= iVar7) * iVar6;
  uVar21 = (uint)(iVar10 < iVar7) * iVar7 | (uint)(iVar10 >= iVar7) * iVar10;
  uVar23 = (uint)(iVar11 < iVar7) * iVar7 | (uint)(iVar11 >= iVar7) * iVar11;
  *(uint *)out[1] = (uint)(iVar3 < (int)uVar25) * iVar3 | (iVar3 >= (int)uVar25) * uVar25;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar3 < (int)uVar28) * iVar3 | (iVar3 >= (int)uVar28) * uVar28;
  *(uint *)(out[1] + 1) = (uint)(iVar3 < (int)uVar30) * iVar3 | (iVar3 >= (int)uVar30) * uVar30;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar3 < (int)uVar32) * iVar3 | (iVar3 >= (int)uVar32) * uVar32;
  *(uint *)out[2] = (uint)(iVar3 < (int)uVar17) * iVar3 | (iVar3 >= (int)uVar17) * uVar17;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar3 < (int)uVar19) * iVar3 | (iVar3 >= (int)uVar19) * uVar19;
  *(uint *)(out[2] + 1) = (uint)(iVar3 < (int)uVar21) * iVar3 | (iVar3 >= (int)uVar21) * uVar21;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar3 < (int)uVar23) * iVar3 | (iVar3 >= (int)uVar23) * uVar23;
  if (do_cols == 0) {
    bVar2 = 10;
    if (10 < bd) {
      bVar2 = (byte)bd;
    }
    local_58 = 0x20 << (bVar2 & 0x1f);
    local_48 = -local_58;
    local_58 = local_58 + -1;
    iStack_54 = local_58;
    iStack_50 = local_58;
    iStack_4c = local_58;
    iStack_44 = local_48;
    iStack_40 = local_48;
    iStack_3c = local_48;
    shift_and_clamp_sse4_1(out,out + 3,(__m128i *)&local_48,(__m128i *)&local_58,out_shift);
    shift_and_clamp_sse4_1(out + 1,out + 2,(__m128i *)&local_48,(__m128i *)&local_58,out_shift);
  }
  return;
}

Assistant:

static void idct4x4_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                           int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3, x, y;

  // Stage 0
  // Stage 1
  // Stage 2
  u0 = in[0];
  u1 = in[1];
  u2 = in[2];
  u3 = in[3];

  x = _mm_mullo_epi32(u0, cospi32);
  y = _mm_mullo_epi32(u2, cospi32);
  v0 = _mm_add_epi32(x, y);
  v0 = _mm_add_epi32(v0, rnding);
  v0 = _mm_srai_epi32(v0, bit);

  v1 = _mm_sub_epi32(x, y);
  v1 = _mm_add_epi32(v1, rnding);
  v1 = _mm_srai_epi32(v1, bit);

  x = _mm_mullo_epi32(u1, cospi48);
  y = _mm_mullo_epi32(u3, cospim16);
  v2 = _mm_add_epi32(x, y);
  v2 = _mm_add_epi32(v2, rnding);
  v2 = _mm_srai_epi32(v2, bit);

  x = _mm_mullo_epi32(u1, cospi16);
  y = _mm_mullo_epi32(u3, cospi48);
  v3 = _mm_add_epi32(x, y);
  v3 = _mm_add_epi32(v3, rnding);
  v3 = _mm_srai_epi32(v3, bit);

  // Stage 3
  addsub_sse4_1(v0, v3, out + 0, out + 3, &clamp_lo, &clamp_hi);
  addsub_sse4_1(v1, v2, out + 1, out + 2, &clamp_lo, &clamp_hi);

  if (!do_cols) {
    log_range = AOMMAX(16, bd + 6);
    clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

    shift_and_clamp_sse4_1(out + 0, out + 3, &clamp_lo, &clamp_hi, out_shift);
    shift_and_clamp_sse4_1(out + 1, out + 2, &clamp_lo, &clamp_hi, out_shift);
  }
}